

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O2

NULLCArray NULLCTypeInfo::MemberName(int member,int *type)

{
  ExternTypeInfo *pEVar1;
  char *pcVar2;
  size_t sVar3;
  uint uVar4;
  int iVar5;
  bool bVar6;
  NULLCArray NVar7;
  
  if (linker == 0) {
    __assert_fail("linker",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                  ,0x2d,"NULLCArray NULLCTypeInfo::MemberName(int, int *)");
  }
  pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                     ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),*type);
  if (pEVar1->subCat == CAT_CLASS) {
    if ((uint)member < (pEVar1->field_8).arrSize) {
      pcVar2 = FastVector<char,_false,_false>::operator[]
                         ((FastVector<char,_false,_false> *)(linker + 0x290),0);
      uVar4 = pEVar1->offsetToName;
      sVar3 = strlen(pcVar2 + uVar4);
      pcVar2 = pcVar2 + uVar4 + ((int)sVar3 + 1);
      iVar5 = 0;
      if (0 < member) {
        iVar5 = member;
      }
      while( true ) {
        sVar3 = strlen(pcVar2);
        uVar4 = (int)sVar3 + 1;
        bVar6 = iVar5 == 0;
        iVar5 = iVar5 + -1;
        if (bVar6) break;
        pcVar2 = pcVar2 + uVar4;
      }
      goto LAB_0020d667;
    }
    pcVar2 = FastVector<char,_false,_false>::operator[]
                       ((FastVector<char,_false,_false> *)(linker + 0x290),pEVar1->offsetToName);
    nullcThrowError("typeid::memberName: member number illegal, type (%s) has only %d members",
                    pcVar2,(ulong)(pEVar1->field_8).arrSize);
  }
  else {
    pcVar2 = FastVector<char,_false,_false>::operator[]
                       ((FastVector<char,_false,_false> *)(linker + 0x290),pEVar1->offsetToName);
    nullcThrowError("typeid::memberName: type (%s) is not a class",pcVar2);
  }
  uVar4 = 0;
  pcVar2 = (char *)0x0;
LAB_0020d667:
  NVar7.len = uVar4;
  NVar7.ptr = pcVar2;
  return NVar7;
}

Assistant:

NULLCArray MemberName(int member, int* type)
	{
		assert(linker);
		NULLCArray ret;

		ExternTypeInfo &exType = linker->exTypes[*type];
		if(exType.subCat != ExternTypeInfo::CAT_CLASS)
		{
			nullcThrowError("typeid::memberName: type (%s) is not a class", &linker->exSymbols[exType.offsetToName]);
			return NULLCArray();
		}
		if((unsigned int)member >= exType.memberCount)
		{
			nullcThrowError("typeid::memberName: member number illegal, type (%s) has only %d members", &linker->exSymbols[exType.offsetToName], exType.memberCount);
			return NULLCArray();
		}
		char *symbols = &linker->exSymbols[0];
		unsigned int strLength = (unsigned int)strlen(symbols + exType.offsetToName) + 1;
		const char *memberName = symbols + exType.offsetToName + strLength;
		for(int n = 0; n < member; n++)
		{
			strLength = (unsigned int)strlen(memberName) + 1;
			memberName += strLength;
		}

		ret.ptr = (char*)memberName;
		ret.len = (unsigned int)strlen(memberName) + 1;
		return ret;
	}